

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::SelectionOptionValue::setValue(SelectionOptionValue *this,string *value)

{
  bool bVar1;
  long in_RDI;
  int sel;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c;
  bool local_1;
  
  bVar1 = Lib::Int::stringToInt
                    ((string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (bVar1) {
    if (((((local_1c == -0x682) || (local_1c + 0x3f3U < 2)) || (local_1c + 0x3ecU < 3)) ||
        (((local_1c == -0x29a || (local_1c + 0x23U < 6)) ||
         ((local_1c + 0x16U < 3 || ((local_1c + 0xbU < 2 || (local_1c + 4U < 9)))))))) ||
       ((local_1c - 10U < 2 ||
        (((((local_1c - 0x14U < 3 || (local_1c - 0x1eU < 6)) || (local_1c == 0x29a)) ||
          ((local_1c - 0x3eaU < 3 || (local_1c - 0x3f2U < 2)))) || (local_1c == 0x682)))))) {
      *(int *)(in_RDI + 0x98) = local_1c;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Options::SelectionOptionValue::setValue(const std::string& value)
{
  int sel;
  if(!Int::stringToInt(value,sel)) return false;
  switch (sel) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 10:
  case 11:
  case 20:
  case 21:
  case 22:

  case 30:
  case 31:
  case 32:
  case 33:
  case 34:
  case 35:

  case 666:

  case 1002:
  case 1003:
  case 1004:
  case 1010:
  case 1011:
  case 1666:
  case -1:
  case -2:
  case -3:
  case -4:
  case -10:
  case -11:
  case -20: // almost same as 20 (but factoring will be on negative and not positive literals)
  case -21:
  case -22:
  case -30: // almost same as 30 (but factoring will be on negative and not positive literals)
  case -31:
  case -32:
  case -33:
  case -34:
  case -35:

  case -666:

  case -1002:
  case -1003:
  case -1004:
  case -1010:
  case -1011: // almost same as 1011 (but factoring will be on negative and not positive literals)
  case -1666:
    actualValue = sel;
    return true;
  default:
    return false;
  }
}